

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O0

void Bmatch_CreatePOMUXes(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtk_Qbf)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  Abc_Obj_t *pAVar5;
  char *pName_00;
  Abc_Obj_t *pAVar6;
  reference ppAVar7;
  bool bVar8;
  int local_84;
  Abc_Obj_t *pAStack_80;
  int j;
  char *local_68;
  char *pName;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> Po_Pool;
  char *pSuffix;
  int level;
  int i;
  Abc_Obj_t *pObjA;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pPo;
  Abc_Ntk_t *pNtk_Qbf_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pSuffix._0_4_ = 1;
  pPo = (Abc_Obj_t *)pNtk_Qbf;
  pNtk_Qbf_local = pNtk2;
  pNtk2_local = pNtk1;
  operator_new__(3);
  Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5415f1;
  std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::vector
            ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName);
  sVar4 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Output_Pool);
  bVar8 = false;
  if (sVar4 == 0) {
    sVar4 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Control_Pool);
    bVar8 = sVar4 == 0;
  }
  if (bVar8) {
    for (pSuffix._4_4_ = 0; iVar2 = pSuffix._4_4_, iVar3 = Abc_NtkPoNum(pNtk2_local), iVar2 < iVar3;
        pSuffix._4_4_ = pSuffix._4_4_ + 1) {
      pObj = Abc_NtkPo(pNtk2_local,pSuffix._4_4_);
      pAStack_80 = Abc_ObjChild0Copy(pObj);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName,
                 &stack0xffffffffffffff80);
    }
    for (pSuffix._4_4_ = 0; iVar2 = pSuffix._4_4_, iVar3 = Abc_NtkPoNum(pNtk_Qbf_local),
        iVar2 < iVar3; pSuffix._4_4_ = pSuffix._4_4_ + 1) {
      pObj = Abc_NtkPo(pNtk_Qbf_local,pSuffix._4_4_);
      Bmatch_Construct_MUXes
                ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName,&pObj,
                 (Abc_Ntk_t **)&pPo,(int *)&pSuffix,&fConst0);
      pSuffix._0_4_ = 1;
    }
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::clear
              ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName);
    for (pSuffix._4_4_ = 0; iVar2 = pSuffix._4_4_, iVar3 = Abc_NtkPoNum(pNtk_Qbf_local),
        iVar2 < iVar3; pSuffix._4_4_ = pSuffix._4_4_ + 1) {
      pObj = Abc_NtkPo(pNtk_Qbf_local,pSuffix._4_4_);
      pAVar1 = *(Abc_Aig_t **)&pPo[3].vFanouts;
      pAVar5 = (pObj->field_6).pCopy;
      pAVar6 = Abc_ObjChild0Copy(pObj);
      pObjA = Abc_AigXor(pAVar1,pAVar5,pAVar6);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName,&pObjA);
    }
    for (local_84 = 0;
        sVar4 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size
                          ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName),
        (ulong)(long)local_84 < sVar4; local_84 = local_84 + 1) {
      _level = Abc_NtkCreatePi((Abc_Ntk_t *)pPo);
      local_68 = "y_";
      pAVar5 = Abc_NtkPo(pNtk_Qbf_local,local_84);
      pName_00 = Abc_ObjName(pAVar5);
      local_68 = Bmatch_NameAddPrefix("y_",2,pName_00);
      Abc_ObjAssignName(_level,local_68,
                        (char *)Po_Pool.
                                super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_68 != (char *)0x0) {
        operator_delete(local_68,1);
      }
      pAVar5 = _level;
      pAVar1 = *(Abc_Aig_t **)&pPo[3].vFanouts;
      pAVar6 = Abc_AigConst1((Abc_Ntk_t *)pPo);
      pAVar6 = Abc_ObjNot(pAVar6);
      ppAVar7 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                          ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName,
                           (long)local_84);
      pObjA = Abc_AigMux(pAVar1,pAVar5,pAVar6,*ppAVar7);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&Output_Pool,&pObjA);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                (&Control_Pool,(value_type *)&level);
    }
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~vector
              ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pName);
    return;
  }
  __assert_fail("Output_Pool.size() == 0 && Control_Pool.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xd2,"void Bmatch_CreatePOMUXes(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Bmatch_CreatePOMUXes( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtk_Qbf )
{
    Abc_Obj_t * pPo, * pObj, * pObjA;
    int i, level = 1;
    char * pSuffix = new char[3]; pSuffix = "_*\0"; 
    vector< Abc_Obj_t * > Po_Pool;
    char * pName;

    assert( Output_Pool.size() == 0 && Control_Pool.size() == 0 );

    Abc_NtkForEachPo( pNtk1, pPo, i)
    {
        Po_Pool.push_back( Abc_ObjChild0Copy(pPo) );  
    }

    // Construct PO MUXes for Ntk2
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        Bmatch_Construct_MUXes( Po_Pool, pPo, pNtk_Qbf, level );
        level = 1;
    }
    Po_Pool.clear();
    
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        pObj = Abc_AigXor( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pPo->pCopy, Abc_ObjChild0Copy(pPo) );
        Po_Pool.push_back( pObj );
    }

    for( int j = 0; j < Po_Pool.size(); ++j){
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        pName = "y_";
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(Abc_NtkPo(pNtk2, j)));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Po_Pool[j] );
        Output_Pool.push_back( pObj );
        Control_Pool.push_back( pObjA );
    }
}